

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O3

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::LinkLastPhisToStart
          (LoopUnrollerUtilsImpl *this,Loop *loop)

{
  Instruction *pIVar1;
  pointer pOVar2;
  uint32_t uVar3;
  array<signed_char,_4UL> aVar4;
  array<signed_char,_4UL> aVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> inductions;
  undefined1 local_78 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_58;
  LoopUnrollerUtilsImpl *local_50;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_48;
  
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = this;
  Loop::GetInductionVariables(loop,&local_48);
  if (local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar10 = 0;
    do {
      pIVar1 = (local_50->state_).previous_phis_.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10];
      uVar3 = GetPhiIndexFromLabel((local_50->state_).previous_latch_block_,pIVar1);
      uVar6 = (pIVar1->has_result_id_ & 1) + 1;
      if (pIVar1->has_type_id_ == false) {
        uVar6 = (uint)pIVar1->has_result_id_;
      }
      aVar4._M_elems = (_Type)Instruction::GetSingleWordOperand(pIVar1,(uVar6 + uVar3) - 1);
      uVar6 = (pIVar1->has_result_id_ & 1) + 1;
      if (pIVar1->has_type_id_ == false) {
        uVar6 = (uint)pIVar1->has_result_id_;
      }
      aVar5._M_elems = (_Type)Instruction::GetSingleWordOperand(pIVar1,uVar6 + uVar3);
      pIVar1 = local_48.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10];
      local_78._0_8_ = &PTR__SmallVector_003d7c78;
      local_78._24_8_ = local_78 + 0x10;
      local_58._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_78._8_8_ = 1;
      uVar6 = (pIVar1->has_result_id_ & 1) + 1;
      if (pIVar1->has_type_id_ == false) {
        uVar6 = (uint)pIVar1->has_result_id_;
      }
      uVar7 = (uVar6 + uVar3) - 1;
      uVar8 = (ulong)uVar7;
      pOVar2 = (pIVar1->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar9 = ((long)(pIVar1->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
              -0x5555555555555555;
      local_78._16_4_ = aVar4._M_elems;
      if (uVar9 < uVar8 || uVar9 - uVar8 == 0) {
LAB_002532c5:
        local_78._24_8_ = local_78 + 0x10;
        local_58._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_78._8_8_ = 1;
        local_78._0_8_ = &PTR__SmallVector_003d7c78;
        __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2b8,
                      "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                     );
      }
      if (uVar7 < uVar6) {
LAB_002532a6:
        local_78._24_8_ = local_78 + 0x10;
        local_58._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_78._8_8_ = 1;
        local_78._0_8_ = &PTR__SmallVector_003d7c78;
        __assert_fail("index >= TypeResultIdCount() && \"operand is not a in-operand\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2b9,
                      "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                     );
      }
      utils::SmallVector<unsigned_int,_2UL>::operator=
                (&pOVar2[uVar8].words,(SmallVector<unsigned_int,_2UL> *)local_78);
      local_78._0_8_ = &PTR__SmallVector_003d7c78;
      if ((_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)
          local_58._M_head_impl !=
          (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_58,local_58._M_head_impl);
      }
      local_78._0_8_ = &PTR__SmallVector_003d7c78;
      local_78._24_8_ = local_78 + 0x10;
      local_58._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_78._8_8_ = 1;
      uVar6 = (pIVar1->has_result_id_ & 1) + 1;
      if (pIVar1->has_type_id_ == false) {
        uVar6 = (uint)pIVar1->has_result_id_;
      }
      uVar9 = (ulong)(uVar3 + uVar6);
      pOVar2 = (pIVar1->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(pIVar1->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
              -0x5555555555555555;
      local_78._16_4_ = aVar5._M_elems;
      if (uVar8 < uVar9 || uVar8 - uVar9 == 0) goto LAB_002532c5;
      if (uVar3 + uVar6 < uVar6) goto LAB_002532a6;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                (&pOVar2[uVar9].words,(SmallVector<unsigned_int,_2UL> *)local_78);
      local_78._0_8_ = &PTR__SmallVector_003d7c78;
      if ((_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)
          local_58._M_head_impl !=
          (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_58,local_58._M_head_impl);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)local_48.
                                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_48.
                                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void LoopUnrollerUtilsImpl::LinkLastPhisToStart(Loop* loop) const {
  std::vector<Instruction*> inductions;
  loop->GetInductionVariables(inductions);

  for (size_t i = 0; i < inductions.size(); ++i) {
    Instruction* last_phi_in_block = state_.previous_phis_[i];

    uint32_t phi_index =
        GetPhiIndexFromLabel(state_.previous_latch_block_, last_phi_in_block);
    uint32_t phi_variable =
        last_phi_in_block->GetSingleWordInOperand(phi_index - 1);
    uint32_t phi_label = last_phi_in_block->GetSingleWordInOperand(phi_index);

    Instruction* phi = inductions[i];
    phi->SetInOperand(phi_index - 1, {phi_variable});
    phi->SetInOperand(phi_index, {phi_label});
  }
}